

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall
ON_V5_MeshDoubleVertices::DeleteAfterRead
          (ON_V5_MeshDoubleVertices *this,ON_BinaryArchive *archive,ON_Object *parent_object)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  ON_Mesh *this_00;
  ON_BoundingBox OStack_48;
  
  if (parent_object == (ON_Object *)0x0) {
    this_00 = (ON_Mesh *)0x0;
  }
  else {
    bVar6 = ON_Object::IsKindOf(parent_object,&ON_Mesh::m_ON_Mesh_class_rtti);
    this_00 = (ON_Mesh *)0x0;
    if (bVar6) {
      this_00 = (ON_Mesh *)parent_object;
    }
  }
  if (((this_00 != (ON_Mesh *)0x0) &&
      ((this_00->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count == 0)) &&
     ((this_00->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count ==
      (this->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>.m_count)) {
    ON_3dPointArray::operator=(&this_00->m_dV,&this->m_V5_dV);
    bVar6 = ON_Mesh::HasSynchronizedDoubleAndSinglePrecisionVertices(this_00);
    dVar5 = ON_BoundingBox::UnsetBoundingBox.m_max.z;
    dVar4 = ON_BoundingBox::UnsetBoundingBox.m_max.x;
    dVar3 = ON_BoundingBox::UnsetBoundingBox.m_min.z;
    dVar2 = ON_BoundingBox::UnsetBoundingBox.m_min.y;
    dVar1 = ON_BoundingBox::UnsetBoundingBox.m_min.x;
    if (bVar6) {
      (this_00->m_vertex_bbox).m_max.y = ON_BoundingBox::UnsetBoundingBox.m_max.y;
      (this_00->m_vertex_bbox).m_max.z = dVar5;
      (this_00->m_vertex_bbox).m_min.z = dVar3;
      (this_00->m_vertex_bbox).m_max.x = dVar4;
      (this_00->m_vertex_bbox).m_min.x = dVar1;
      (this_00->m_vertex_bbox).m_min.y = dVar2;
      ON_BoundingBoxCache::RemoveAllBoundingBoxes(&this_00->m_tight_bbox_cache);
      ON_Geometry::BoundingBox(&OStack_48,&this_00->super_ON_Geometry);
    }
    else {
      ON_SimpleArray<ON_3dPoint>::SetCapacity(&(this_00->m_dV).super_ON_SimpleArray<ON_3dPoint>,0);
    }
  }
  return true;
}

Assistant:

bool ON_V5_MeshDoubleVertices::DeleteAfterRead(
  const class ON_BinaryArchive& archive,
  class ON_Object* parent_object
  ) const
{
  ON_Mesh* mesh = ON_Mesh::Cast(parent_object);
  if (nullptr != mesh && 0 == mesh->m_dV.UnsignedCount() )
  {
    const unsigned int vertex_count = mesh->VertexUnsignedCount();
    if (vertex_count == m_V5_dV.UnsignedCount())
    {
      mesh->m_dV = m_V5_dV;
      if (false == mesh->HasSynchronizedDoubleAndSinglePrecisionVertices())
        mesh->DestroyDoublePrecisionVertices();
      else
      {
        // update vertex bounding boxes
        mesh->InvalidateVertexBoundingBox();
        mesh->BoundingBox();
      }
    }
  }
  return true;
}